

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int request_contains_shutdown_token(http_s *request)

{
  int *piVar1;
  char *__s1;
  char cVar2;
  int iVar3;
  FIOBJ key;
  FIOBJ FVar4;
  char *__s2;
  fiobj_object_vtable_s *pfVar5;
  uintptr_t uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 *puVar9;
  fio_str_info_s ret;
  fio_str_info_s local_38;
  
  iVar3 = http_parse_body(request);
  if (iVar3 != 0) {
    return 0;
  }
  key = fiobj_str_new("token",5);
  uVar7 = 0;
  if ((((uint)request->params & 7) == 4) &&
     (FVar4 = fiobj_hash_get(request->params,key), FVar4 != 0)) {
    FVar4 = fiobj_hash_get(request->params,key);
    if (FVar4 == 0) {
LAB_001052f4:
      local_38.data = anon_var_dwarf_1dd;
      local_38.len._0_4_ = 4;
      goto LAB_00105307;
    }
    cVar2 = (char)FVar4;
    if ((FVar4 & 1) == 0) {
      switch((uint)FVar4 & 6) {
      case 0:
        cVar2 = *(char *)(FVar4 & 0xfffffffffffffff8);
LAB_00105286:
        switch(cVar2) {
        case '\'':
          pfVar5 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          goto switchD_0010527b_caseD_2;
        case ')':
          pfVar5 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          goto switchD_0010527b_caseD_4;
        case '+':
          pfVar5 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar5 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_0010527b_caseD_2:
        pfVar5 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_0010527b_caseD_4:
        pfVar5 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if (cVar2 == '&') {
          local_38.data = anon_var_dwarf_1e8;
          local_38.len._0_4_ = 5;
        }
        else {
          uVar7 = (uint)FVar4 & 0xff;
          if (uVar7 != 0x16) {
            if (uVar7 == 6) goto LAB_001052f4;
            goto LAB_00105286;
          }
          local_38.data = anon_var_dwarf_1f3;
          local_38.len._0_4_ = 4;
        }
LAB_00105307:
        local_38.capa._0_4_ = 0;
        local_38.capa._4_4_ = 0;
        local_38.len._4_4_ = 0;
        goto LAB_0010530b;
      }
      (*pfVar5->to_str)(&local_38,FVar4);
    }
    else {
      fio_ltocstr(&local_38,(long)FVar4 >> 1);
    }
LAB_0010530b:
    __s1 = local_38.data;
    __s2 = getenv("RSHUTDOWN_TOKEN");
    iVar3 = strcmp(__s1,__s2);
    uVar7 = (uint)(iVar3 == 0);
  }
  uVar8 = (uint)key & 6;
  if (uVar8 == 6) {
    return uVar7;
  }
  if (key == 0) {
    return uVar7;
  }
  if ((key & 1) != 0) {
    return uVar7;
  }
  puVar9 = (undefined1 *)(key & 0xfffffffffffffff8);
  LOCK();
  piVar1 = (int *)(puVar9 + 4);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return uVar7;
  }
  if ((key & 6) == 0) {
    switch(*puVar9) {
    case 0x27:
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_00105398_caseD_28;
    case 0x29:
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_00105398_caseD_2a;
    case 0x2b:
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar8 == 2) {
switchD_00105398_caseD_28:
    pfVar5 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_00105398_caseD_2a:
    pfVar5 = &FIOBJECT_VTABLE_HASH;
  }
  if (pfVar5->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
    if ((key & 6) == 0) {
      switch(*puVar9) {
      case 0x27:
        pfVar5 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        goto switchD_001053e3_caseD_28;
      case 0x29:
        pfVar5 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        goto switchD_001053e3_caseD_2a;
      case 0x2b:
        pfVar5 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar5 = &FIOBJECT_VTABLE_NUMBER;
      }
    }
    else if (uVar8 == 2) {
switchD_001053e3_caseD_28:
      pfVar5 = &FIOBJECT_VTABLE_STRING;
    }
    else {
switchD_001053e3_caseD_2a:
      pfVar5 = &FIOBJECT_VTABLE_HASH;
    }
    uVar6 = (*pfVar5->count)(key);
    if (uVar6 != 0) {
      fiobj_free_complex_object(key);
      return uVar7;
    }
  }
  if ((key & 6) == 0) {
    switch(*puVar9) {
    case 0x27:
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_0010543f_caseD_28;
    case 0x29:
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_0010543f_caseD_2a;
    case 0x2b:
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else {
    if (uVar8 != 2) {
switchD_0010543f_caseD_2a:
      pfVar5 = &FIOBJECT_VTABLE_HASH;
      goto LAB_00105451;
    }
switchD_0010543f_caseD_28:
    pfVar5 = &FIOBJECT_VTABLE_STRING;
  }
LAB_00105451:
  (*pfVar5->dealloc)(key,(_func_void_FIOBJ_void_ptr *)0x0,(void *)0x0);
  return uVar7;
}

Assistant:

int request_contains_shutdown_token(http_s *request) {
  int contains_shutdown_token = 0;

  if (http_parse_body(request) != 0) {
    return 0;
  }

  FIOBJ key = fiobj_str_new("token", 5);
  if (
    FIOBJ_TYPE_IS(request->params, FIOBJ_T_HASH)  /* check if JSON object is a hash, */
    && fiobj_hash_get(request->params, key)  /* test for existence of "token", */
    && !strcmp(fiobj_obj2cstr(fiobj_hash_get(request->params, key)).data,
        getenv("RSHUTDOWN_TOKEN"))  /* and test if token matches RSHUTDOWN_TOKEN */
  ) {
    contains_shutdown_token = 1;
  }
  fiobj_free(key);

  return contains_shutdown_token;
}